

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O3

void load_GL_NV_fence(GLADloadproc load)

{
  if (GLAD_GL_NV_fence != 0) {
    glad_glDeleteFencesNV = (PFNGLDELETEFENCESNVPROC)(*load)("glDeleteFencesNV");
    glad_glGenFencesNV = (PFNGLGENFENCESNVPROC)(*load)("glGenFencesNV");
    glad_glIsFenceNV = (PFNGLISFENCENVPROC)(*load)("glIsFenceNV");
    glad_glTestFenceNV = (PFNGLTESTFENCENVPROC)(*load)("glTestFenceNV");
    glad_glGetFenceivNV = (PFNGLGETFENCEIVNVPROC)(*load)("glGetFenceivNV");
    glad_glFinishFenceNV = (PFNGLFINISHFENCENVPROC)(*load)("glFinishFenceNV");
    glad_glSetFenceNV = (PFNGLSETFENCENVPROC)(*load)("glSetFenceNV");
  }
  return;
}

Assistant:

static void load_GL_NV_fence(GLADloadproc load) {
	if(!GLAD_GL_NV_fence) return;
	glad_glDeleteFencesNV = (PFNGLDELETEFENCESNVPROC)load("glDeleteFencesNV");
	glad_glGenFencesNV = (PFNGLGENFENCESNVPROC)load("glGenFencesNV");
	glad_glIsFenceNV = (PFNGLISFENCENVPROC)load("glIsFenceNV");
	glad_glTestFenceNV = (PFNGLTESTFENCENVPROC)load("glTestFenceNV");
	glad_glGetFenceivNV = (PFNGLGETFENCEIVNVPROC)load("glGetFenceivNV");
	glad_glFinishFenceNV = (PFNGLFINISHFENCENVPROC)load("glFinishFenceNV");
	glad_glSetFenceNV = (PFNGLSETFENCENVPROC)load("glSetFenceNV");
}